

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

JObject * __thiscall
pstack::JObject::field<char[13],pstack::DumpCFAInsns,pstack::Dwarf::CFI_const*>
          (JObject *this,char (*k) [13],DumpCFAInsns *v,CFI **c)

{
  ostream *os;
  undefined1 local_40 [8];
  Field<char[13],_pstack::DumpCFAInsns> field;
  
  local_40 = (undefined1  [8])k;
  field.k = (char (*) [13])v;
  os = std::operator<<(this->os,this->sep);
  field.v = (DumpCFAInsns *)local_40;
  pstack::operator<<(os,(JSON<pstack::Field<char[13],_pstack::DumpCFAInsns>,_const_pstack::Dwarf::CFI_*>
                         *)&field.v);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }